

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_sendmsg(uv_udp_t *handle)

{
  uv__queue *puVar1;
  short sVar2;
  uv__queue *puVar3;
  int iVar4;
  uv__queue *puVar5;
  int *piVar6;
  ulong uVar7;
  socklen_t sVar8;
  ulong uVar9;
  mmsghdr h [20];
  
  puVar1 = &handle->write_queue;
  puVar5 = (handle->write_queue).next;
  if (puVar5 == puVar1) {
    return;
  }
  uVar9 = 0;
  while( true ) {
    for (; uVar9 < 0x14 && puVar5 != puVar1; uVar9 = uVar9 + 1) {
      if (puVar5 == (uv__queue *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                      ,0x127,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      *(undefined8 *)&h[uVar9].msg_hdr.msg_flags = 0;
      *(undefined8 *)&h[uVar9].msg_len = 0;
      h[uVar9].msg_hdr.msg_control = (void *)0x0;
      h[uVar9].msg_hdr.msg_controllen = 0;
      h[uVar9].msg_hdr.msg_iov = (iovec *)0x0;
      h[uVar9].msg_hdr.msg_iovlen = 0;
      h[uVar9].msg_hdr.msg_name = (void *)0x0;
      *(undefined8 *)&h[uVar9].msg_hdr.msg_namelen = 0;
      if (*(short *)&puVar5[1].next != 0) {
        h[uVar9].msg_hdr.msg_name = puVar5 + 1;
        sVar2 = *(short *)&puVar5[1].next;
        if (sVar2 == 1) {
          sVar8 = 0x6e;
        }
        else {
          sVar8 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                            ,0x139,"void uv__udp_sendmsg(uv_udp_t *)");
            }
            sVar8 = 0x10;
          }
        }
        h[uVar9].msg_hdr.msg_namelen = sVar8;
      }
      h[uVar9].msg_hdr.msg_iov = (iovec *)puVar5[9].prev;
      h[uVar9].msg_hdr.msg_iovlen = (ulong)*(uint *)&puVar5[9].next;
      puVar5 = puVar5->next;
    }
    while (iVar4 = sendmmsg((handle->io_watcher).fd,h,uVar9 & 0xffffffff,0), iVar4 == -1) {
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      if (iVar4 != 4) goto LAB_0016a373;
    }
    if (iVar4 < 1) break;
    uVar9 = 0;
    while ((puVar5 = puVar1->next, uVar9 < (ulong)(long)iVar4 && (puVar5 != puVar1))) {
      if (puVar5 == (uv__queue *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                      ,0x15d,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      puVar5[10].next = (puVar5[9].prev)->prev;
      puVar3 = puVar5->next;
      puVar5->prev->next = puVar3;
      puVar3->prev = puVar5->prev;
      puVar5->next = &handle->write_completed_queue;
      puVar3 = (handle->write_completed_queue).prev;
      puVar5->prev = puVar3;
      puVar3->next = puVar5;
      (handle->write_completed_queue).prev = puVar5;
      uVar9 = uVar9 + 1;
    }
    uVar9 = 0;
    if (puVar5 == puVar1) goto LAB_0016a3ce;
  }
  piVar6 = __errno_location();
  iVar4 = *piVar6;
LAB_0016a373:
  if (iVar4 == 0xb) {
    return;
  }
  if (iVar4 == 0x69) {
    return;
  }
  uVar7 = 0;
  while ((uVar7 < uVar9 && (puVar5 = puVar1->next, puVar5 != puVar1))) {
    if (puVar5 == (uv__queue *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/udp.c"
                    ,0x14b,"void uv__udp_sendmsg(uv_udp_t *)");
    }
    puVar5[10].next = (uv__queue *)-(long)*piVar6;
    puVar3 = puVar5->next;
    puVar5->prev->next = puVar3;
    puVar3->prev = puVar5->prev;
    puVar5->next = &handle->write_completed_queue;
    puVar3 = (handle->write_completed_queue).prev;
    puVar5->prev = puVar3;
    puVar3->next = puVar5;
    (handle->write_completed_queue).prev = puVar5;
    uVar7 = uVar7 + 1;
  }
LAB_0016a3ce:
  uv__io_feed(handle->loop,&handle->io_watcher);
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
#if defined(__linux__) || defined(__FreeBSD__)
  uv_udp_send_t* req;
  struct mmsghdr h[20];
  struct mmsghdr* p;
  struct uv__queue* q;
  ssize_t npkts;
  size_t pkts;
  size_t i;

  if (uv__queue_empty(&handle->write_queue))
    return;

write_queue_drain:
  for (pkts = 0, q = uv__queue_head(&handle->write_queue);
       pkts < ARRAY_SIZE(h) && q != &handle->write_queue;
       ++pkts, q = uv__queue_head(q)) {
    assert(q != NULL);
    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    p = &h[pkts];
    memset(p, 0, sizeof(*p));
    if (req->addr.ss_family == AF_UNSPEC) {
      p->msg_hdr.msg_name = NULL;
      p->msg_hdr.msg_namelen = 0;
    } else {
      p->msg_hdr.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h[pkts].msg_hdr.msg_iov = (struct iovec*) req->bufs;
    h[pkts].msg_hdr.msg_iovlen = req->nbufs;
  }

  do
    npkts = sendmmsg(handle->io_watcher.fd, h, pkts, 0);
  while (npkts == -1 && errno == EINTR);

  if (npkts < 1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
      return;
    for (i = 0, q = uv__queue_head(&handle->write_queue);
         i < pkts && q != &handle->write_queue;
         ++i, q = uv__queue_head(&handle->write_queue)) {
      assert(q != NULL);
      req = uv__queue_data(q, uv_udp_send_t, queue);
      assert(req != NULL);

      req->status = UV__ERR(errno);
      uv__queue_remove(&req->queue);
      uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
    }
    uv__io_feed(handle->loop, &handle->io_watcher);
    return;
  }

  /* Safety: npkts known to be >0 below. Hence cast from ssize_t
   * to size_t safe.
   */
  for (i = 0, q = uv__queue_head(&handle->write_queue);
       i < (size_t)npkts && q != &handle->write_queue;
       ++i, q = uv__queue_head(&handle->write_queue)) {
    assert(q != NULL);
    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    req->status = req->bufs[0].len;

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    uv__queue_remove(&req->queue);
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
  }

  /* couldn't batch everything, continue sending (jump to avoid stack growth) */
  if (!uv__queue_empty(&handle->write_queue))
    goto write_queue_drain;
  uv__io_feed(handle->loop, &handle->io_watcher);
#else  /* __linux__ || ____FreeBSD__ */
  uv_udp_send_t* req;
  struct msghdr h;
  struct uv__queue* q;
  ssize_t size;

  while (!uv__queue_empty(&handle->write_queue)) {
    q = uv__queue_head(&handle->write_queue);
    assert(q != NULL);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    uv__queue_remove(&req->queue);
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
#endif  /* __linux__ || ____FreeBSD__ */
}